

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

void __thiscall
cmCommandArgumentParserHelper::SetMakefile(cmCommandArgumentParserHelper *this,cmMakefile *mf)

{
  bool bVar1;
  cmake *pcVar2;
  cmMakefile *mf_local;
  cmCommandArgumentParserHelper *this_local;
  
  this->Makefile = mf;
  pcVar2 = cmMakefile::GetCMakeInstance(mf);
  bVar1 = cmake::GetWarnUninitialized(pcVar2);
  this->WarnUninitialized = bVar1;
  pcVar2 = cmMakefile::GetCMakeInstance(mf);
  bVar1 = cmake::GetCheckSystemVars(pcVar2);
  this->CheckSystemVars = bVar1;
  return;
}

Assistant:

void cmCommandArgumentParserHelper::SetMakefile(const cmMakefile* mf)
{
  this->Makefile = mf;
  this->WarnUninitialized = mf->GetCMakeInstance()->GetWarnUninitialized();
  this->CheckSystemVars = mf->GetCMakeInstance()->GetCheckSystemVars();
}